

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::StringParseTester::ByteSizeLong(StringParseTester *this)

{
  uint uVar1;
  size_t sVar2;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  sVar2 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  uVar1 = *(uint *)((long)&this->field_0 + 0x28);
  lVar7 = sVar2 + uVar1;
  uVar6 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar6 = uVar1;
    uVar5 = 0;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pVVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(this->field_0)._impl_.repeated_string_lowfield_.super_RepeatedPtrFieldBase
                        ,uVar5);
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize(pVVar3);
    lVar7 = lVar7 + sVar2;
  }
  uVar1 = *(uint *)((long)&this->field_0 + 0x40);
  lVar7 = lVar7 + (ulong)uVar1 * 2;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = uVar1;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pVVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(this->field_0)._impl_.repeated_string_midfield_.super_RepeatedPtrFieldBase
                        ,uVar5);
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize(pVVar3);
    lVar7 = lVar7 + sVar2;
  }
  uVar1 = *(uint *)((long)&this->field_0 + 0x58);
  sVar2 = lVar7 + (ulong)uVar1 * 4;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = uVar1;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pVVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (&(this->field_0)._impl_.repeated_string_hifield_.super_RepeatedPtrFieldBase,
                        uVar5);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(pVVar3);
    sVar2 = sVar2 + sVar4;
  }
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.optional_string_lowfield_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar2 = sVar2 + sVar4 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.optional_string_midfield_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar2 = sVar2 + sVar4 + 2;
    }
    if ((uVar1 & 4) != 0) {
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.optional_string_hifield_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar2 = sVar2 + sVar4 + 4;
    }
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar2,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t StringParseTester::ByteSizeLong() const {
  const StringParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.StringParseTester)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated string repeated_string_lowfield = 2;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_lowfield().size());
      for (int i = 0, n = this_._internal_repeated_string_lowfield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_lowfield().Get(i));
      }
    }
    // repeated string repeated_string_midfield = 1002;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_midfield().size());
      for (int i = 0, n = this_._internal_repeated_string_midfield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_midfield().Get(i));
      }
    }
    // repeated string repeated_string_hifield = 1000002;
    {
      total_size +=
          4 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_hifield().size());
      for (int i = 0, n = this_._internal_repeated_string_hifield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_hifield().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // string optional_string_lowfield = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_lowfield());
    }
    // string optional_string_midfield = 1001;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_midfield());
    }
    // string optional_string_hifield = 1000001;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 4 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_hifield());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}